

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFOutlineObjectHelper::getDest(QPDFOutlineObjectHelper *this)

{
  QPDFOutlineDocumentHelper *name;
  bool bVar1;
  QPDFObjectHandle *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  QPDFObjectHandle QVar3;
  bool local_25a;
  QPDFObjectHandle local_220;
  undefined1 local_210 [24];
  string local_1f8 [32];
  QPDFObjectHandle local_1d8;
  byte local_1c3;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  byte local_19d;
  byte local_19c;
  byte local_19b;
  byte local_19a;
  allocator<char> local_199;
  string local_198 [32];
  QPDFObjectHandle local_178;
  string local_168;
  byte local_144;
  byte local_143;
  byte local_142;
  allocator<char> local_141;
  string local_140 [32];
  QPDFObjectHandle local_120;
  allocator<char> local_109;
  string local_108 [32];
  undefined1 local_e8 [40];
  string local_c0 [32];
  undefined1 local_a0 [40];
  string local_78;
  undefined1 local_48 [24];
  QPDFObjectHandle A;
  QPDFObjectHandle dest;
  QPDFOutlineObjectHelper *this_local;
  
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &A.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)(local_48 + 0x10));
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"/Dest",(allocator<char> *)(local_a0 + 0x27));
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_48,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x27));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  if (bVar1) {
    QTC::TC("qpdf","QPDFOutlineObjectHelper direct dest",0);
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"/Dest",(allocator<char> *)(local_e8 + 0x27));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_a0 + 0x10),(string *)local_a0);
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)
               &A.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(QPDFObjectHandle *)(local_a0 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_a0 + 0x10));
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x27));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a0);
  }
  else {
    local_142 = 0;
    local_143 = 0;
    local_144 = 0;
    local_19a = 0;
    local_19b = 0;
    local_19c = 0;
    local_19d = 0;
    local_1c2 = 0;
    local_1c3 = 0;
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,"/A",&local_109);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_e8 + 0x10),(string *)local_e8);
    this_00 = QPDFObjectHandle::operator=
                        ((QPDFObjectHandle *)(local_48 + 0x10),(QPDFObjectHandle *)(local_e8 + 0x10)
                        );
    bVar1 = QPDFObjectHandle::isDictionary(this_00);
    local_25a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_142 = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_140,"/S",&local_141);
      local_143 = 1;
      QPDFObjectHandle::getKey(&local_120,(string *)(local_48 + 0x10));
      local_144 = 1;
      bVar1 = QPDFObjectHandle::isName(&local_120);
      local_25a = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_19a = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_198,"/S",&local_199);
        local_19b = 1;
        QPDFObjectHandle::getKey(&local_178,(string *)(local_48 + 0x10));
        local_19c = 1;
        QPDFObjectHandle::getName_abi_cxx11_(&local_168,&local_178);
        local_19d = 1;
        bVar1 = std::operator==(&local_168,"/GoTo");
        local_25a = false;
        if (bVar1) {
          std::allocator<char>::allocator();
          local_1c2 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"/D",&local_1c1);
          local_1c3 = 1;
          local_25a = QPDFObjectHandle::hasKey((QPDFObjectHandle *)(local_48 + 0x10),&local_1c0);
        }
      }
    }
    if ((local_1c3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    if ((local_1c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c1);
    }
    if ((local_19d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_168);
    }
    if ((local_19c & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_178);
    }
    if ((local_19b & 1) != 0) {
      std::__cxx11::string::~string(local_198);
    }
    if ((local_19a & 1) != 0) {
      std::allocator<char>::~allocator(&local_199);
    }
    if ((local_144 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_120);
    }
    if ((local_143 & 1) != 0) {
      std::__cxx11::string::~string(local_140);
    }
    if ((local_142 & 1) != 0) {
      std::allocator<char>::~allocator(&local_141);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_e8 + 0x10));
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
    if (local_25a != false) {
      QTC::TC("qpdf","QPDFOutlineObjectHelper action dest",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1f8,"/D",(allocator<char> *)(local_210 + 0x17));
      QPDFObjectHandle::getKey(&local_1d8,(string *)(local_48 + 0x10));
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)
                 &A.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_1d8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)(local_210 + 0x17));
    }
  }
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool
                    ((BaseHandle *)
                     &A.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isName
                      ((QPDFObjectHandle *)
                       &A.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((bVar1) ||
       (bVar1 = QPDFObjectHandle::isString
                          ((QPDFObjectHandle *)
                           &A.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount),
       bVar1)) {
      QTC::TC("qpdf","QPDFOutlineObjectHelper named dest",0);
      peVar2 = std::
               __shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 0x28));
      name = peVar2->dh;
      QPDFObjectHandle::QPDFObjectHandle
                (&local_220,
                 (QPDFObjectHandle *)
                 &A.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      QPDFOutlineDocumentHelper::resolveNamedDest
                ((QPDFOutlineDocumentHelper *)local_210,(QPDFObjectHandle *)name);
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)
                 &A.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(QPDFObjectHandle *)local_210);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_210);
      QPDFObjectHandle::~QPDFObjectHandle(&local_220);
    }
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)this,
               (QPDFObjectHandle *)
               &A.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    QPDFObjectHandle::newNull();
  }
  local_210._16_4_ = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_48 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &A.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineObjectHelper::getDest()
{
    QPDFObjectHandle dest;
    QPDFObjectHandle A;
    if (oh().hasKey("/Dest")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper direct dest");
        dest = oh().getKey("/Dest");
    } else if (
        (A = oh().getKey("/A")).isDictionary() && A.getKey("/S").isName() &&
        (A.getKey("/S").getName() == "/GoTo") && A.hasKey("/D")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper action dest");
        dest = A.getKey("/D");
    }
    if (!dest) {
        return QPDFObjectHandle::newNull();
    }

    if (dest.isName() || dest.isString()) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper named dest");
        dest = m->dh.resolveNamedDest(dest);
    }

    return dest;
}